

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void __thiscall Solver_MCSVM_CS::Solve(Solver_MCSVM_CS *this,double *w)

{
  double *pdVar1;
  undefined4 uVar2;
  int iVar3;
  double *pdVar4;
  feature_node **ppfVar5;
  problem *ppVar6;
  double *pdVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  void *__s;
  ulong uVar13;
  double *alpha_new;
  void *pvVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  long lVar21;
  feature_node *pfVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  void *pvVar32;
  long lVar33;
  feature_node *pfVar34;
  int iVar35;
  int t;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  int local_f8;
  double local_e0;
  
  iVar11 = this->l;
  uVar36 = (ulong)iVar11;
  uVar23 = this->nr_class;
  lVar27 = (long)(int)uVar23;
  uVar10 = uVar23 * iVar11;
  uVar29 = (long)(int)uVar10 * 8;
  if ((int)uVar10 < 0) {
    uVar29 = 0xffffffffffffffff;
  }
  uVar12 = (long)(int)uVar10 * 4;
  if ((int)uVar10 < 0) {
    uVar12 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar29);
  uVar29 = lVar27 * 8;
  if (lVar27 < 0) {
    uVar29 = 0xffffffffffffffff;
  }
  uVar13 = lVar27 * 4;
  if (lVar27 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  alpha_new = (double *)operator_new__(uVar29);
  uVar38 = uVar36 * 4;
  if ((long)uVar36 < 0) {
    uVar38 = 0xffffffffffffffff;
  }
  uVar37 = uVar36 * 8;
  if ((long)uVar36 < 0) {
    uVar37 = 0xffffffffffffffff;
  }
  pvVar14 = operator_new__(uVar38);
  pvVar15 = operator_new__(uVar37);
  pvVar16 = operator_new__(uVar13);
  pvVar17 = operator_new__(uVar29);
  pvVar18 = operator_new__(uVar12);
  pvVar19 = operator_new__(uVar38);
  pvVar20 = operator_new__(uVar38);
  local_e0 = this->eps;
  if (0 < (int)uVar10) {
    memset(__s,0,(ulong)uVar10 << 3);
  }
  uVar10 = this->w_size * uVar23;
  if (0 < (int)uVar10) {
    memset(w,0,(ulong)uVar10 << 3);
  }
  local_e0 = local_e0 * 10.0;
  if (0 < iVar11) {
    pdVar4 = this->prob->y;
    ppfVar5 = this->prob->x;
    uVar29 = 0;
    pvVar32 = pvVar18;
    do {
      if (0 < (int)uVar23) {
        uVar12 = 0;
        do {
          *(int *)((long)pvVar32 + uVar12 * 4) = (int)uVar12;
          uVar12 = uVar12 + 1;
        } while (uVar23 != uVar12);
      }
      pfVar22 = ppfVar5[uVar29];
      *(undefined8 *)((long)pvVar15 + uVar29 * 8) = 0;
      if (pfVar22->index != -1) {
        dVar40 = *(double *)((long)pvVar15 + uVar29 * 8);
        do {
          pfVar34 = pfVar22 + 1;
          dVar40 = dVar40 + pfVar22->value * pfVar22->value;
          *(double *)((long)pvVar15 + uVar29 * 8) = dVar40;
          pfVar22 = pfVar34;
        } while (pfVar34->index != -1);
      }
      *(uint *)((long)pvVar20 + uVar29 * 4) = uVar23;
      *(int *)((long)pvVar19 + uVar29 * 4) = (int)pdVar4[uVar29];
      *(int *)((long)pvVar14 + uVar29 * 4) = (int)uVar29;
      uVar29 = uVar29 + 1;
      pvVar32 = (void *)((long)pvVar32 + (ulong)uVar23 * 4);
    } while (uVar29 != uVar36);
  }
  if (local_e0 <= 1.0) {
    local_e0 = 1.0;
  }
  bVar9 = true;
  local_f8 = 0;
  do {
    if (this->max_iter <= local_f8) break;
    if (0 < (int)uVar36) {
      uVar29 = uVar36 & 0xffffffff;
      lVar27 = 0;
      do {
        iVar11 = rand();
        lVar21 = iVar11 % (int)uVar29 + lVar27;
        uVar2 = *(undefined4 *)((long)pvVar14 + lVar27 * 4);
        *(undefined4 *)((long)pvVar14 + lVar27 * 4) = *(undefined4 *)((long)pvVar14 + lVar21 * 4);
        *(undefined4 *)((long)pvVar14 + lVar21 * 4) = uVar2;
        lVar27 = lVar27 + 1;
        uVar29 = uVar29 - 1;
      } while (uVar29 != 0);
    }
    if ((int)uVar36 < 1) {
      dVar40 = -INFINITY;
    }
    else {
      iVar11 = 0;
      dVar40 = -INFINITY;
      do {
        iVar28 = *(int *)((long)pvVar14 + (long)iVar11 * 4);
        lVar27 = (long)iVar28;
        dVar41 = *(double *)((long)pvVar15 + lVar27 * 8);
        if (0.0 < dVar41) {
          iVar31 = this->nr_class;
          uVar23 = *(uint *)((long)pvVar20 + lVar27 * 4);
          uVar29 = (ulong)uVar23;
          if (0 < (int)uVar23) {
            pdVar4 = this->G;
            uVar12 = 0;
            do {
              pdVar4[uVar12] = 1.0;
              uVar12 = uVar12 + 1;
            } while (uVar29 != uVar12);
          }
          iVar30 = *(int *)((long)pvVar19 + lVar27 * 4);
          if (iVar30 < (int)uVar23) {
            this->G[iVar30] = 0.0;
          }
          lVar21 = (long)(iVar31 * iVar28);
          ppVar6 = this->prob;
          pfVar22 = ppVar6->x[lVar27];
          iVar25 = pfVar22->index;
          if (iVar25 != -1) {
            pdVar4 = this->G;
            do {
              if (0 < (int)uVar23) {
                uVar12 = 0;
                do {
                  pdVar4[uVar12] =
                       w[(long)((iVar25 + -1) * iVar31) +
                         (long)*(int *)((long)pvVar18 + uVar12 * 4 + lVar21 * 4)] * pfVar22->value +
                       pdVar4[uVar12];
                  uVar12 = uVar12 + 1;
                } while (uVar29 != uVar12);
              }
              iVar25 = pfVar22[1].index;
              pfVar22 = pfVar22 + 1;
            } while (iVar25 != -1);
          }
          dVar42 = INFINITY;
          dVar44 = -INFINITY;
          if (0 < (int)uVar23) {
            uVar12 = 0;
            dVar44 = -INFINITY;
            dVar42 = INFINITY;
            do {
              pdVar4 = (double *)
                       ((long)__s +
                       (long)*(int *)((long)pvVar18 + uVar12 * 4 + lVar21 * 4) * 8 + lVar21 * 8);
              if ((*pdVar4 <= 0.0 && *pdVar4 != 0.0) && (dVar43 = this->G[uVar12], dVar43 < dVar42))
              {
                dVar42 = dVar43;
              }
              dVar43 = this->G[uVar12];
              if (dVar43 <= dVar44) {
                dVar43 = dVar44;
              }
              dVar44 = dVar43;
              uVar12 = uVar12 + 1;
            } while (uVar29 != uVar12);
          }
          if (((iVar30 < (int)uVar23) &&
              (pdVar4 = (double *)((long)__s + (long)(int)ppVar6->y[lVar27] * 8 + lVar21 * 8),
              *pdVar4 <= this->C[(int)ppVar6->y[lVar27]] &&
              this->C[(int)ppVar6->y[lVar27]] != *pdVar4)) && (this->G[iVar30] < dVar42)) {
            dVar42 = this->G[iVar30];
          }
          uVar23 = *(uint *)((long)pvVar20 + lVar27 * 4);
          uVar29 = (ulong)uVar23;
          if (0 < (int)uVar23) {
            pdVar4 = this->C;
            pdVar7 = this->G;
            uVar23 = *(uint *)((long)pvVar19 + lVar27 * 4);
            uVar12 = 0;
            do {
              dVar43 = 0.0;
              if (uVar12 == uVar23) {
                dVar43 = pdVar4[(int)ppVar6->y[lVar27]];
              }
              iVar31 = *(int *)((long)pvVar18 + uVar12 * 4 + lVar21 * 4);
              pdVar1 = (double *)((long)__s + (long)iVar31 * 8 + lVar21 * 8);
              if (((dVar43 == *pdVar1) && (!NAN(dVar43) && !NAN(*pdVar1))) &&
                 (pdVar7[uVar12] <= dVar42 && dVar42 != pdVar7[uVar12])) {
                iVar30 = (int)uVar29;
                lVar39 = (long)iVar30;
                lVar24 = lVar39 * 4 + lVar21 * 4 + -4;
                lVar26 = 0;
                do {
                  lVar33 = lVar26;
                  iVar25 = (int)lVar33;
                  if (lVar33 + lVar39 + -1 <= (long)uVar12) {
                    uVar29 = (ulong)((iVar30 + iVar25) - 1);
                    goto LAB_00104cb8;
                  }
                  dVar43 = 0.0;
                  iVar35 = ((iVar30 + -1) - uVar23) + iVar25;
                  if (iVar35 == 0) {
                    dVar43 = this->C[(int)ppVar6->y[lVar27]];
                  }
                  iVar3 = *(int *)((long)pvVar18 + lVar33 * 4 + lVar24);
                  pdVar1 = (double *)((long)__s + (long)iVar3 * 8 + lVar21 * 8);
                } while (((dVar43 == *pdVar1) && (!NAN(dVar43) && !NAN(*pdVar1))) &&
                        (lVar26 = lVar33 + -1,
                        this->G[lVar39 + lVar33 + -1] <= dVar42 &&
                        dVar42 != this->G[lVar39 + lVar33 + -1]));
                uVar10 = iVar30 + -1 + iVar25;
                uVar29 = (ulong)uVar10;
                if (uVar12 == uVar23) {
                  uVar23 = uVar10;
                }
                *(int *)((long)pvVar18 + uVar12 * 4 + lVar21 * 4) = iVar3;
                *(int *)((long)pvVar18 + lVar33 * 4 + lVar24) = iVar31;
                dVar43 = pdVar7[uVar12];
                pdVar7[uVar12] = pdVar7[lVar39 + lVar33 + -1];
                pdVar7[lVar39 + lVar33 + -1] = dVar43;
                if (iVar35 == 0) {
                  uVar23 = (uint)uVar12;
                }
              }
LAB_00104cb8:
              uVar12 = uVar12 + 1;
            } while ((long)uVar12 < (long)(int)uVar29);
            *(uint *)((long)pvVar19 + lVar27 * 4) = uVar23;
          }
          iVar31 = (int)uVar29;
          *(int *)((long)pvVar20 + lVar27 * 4) = iVar31;
          if (iVar31 < 2) {
            iVar31 = (int)uVar36;
            uVar36 = (ulong)(iVar31 - 1);
            *(undefined4 *)((long)pvVar14 + (long)iVar11 * 4) =
                 *(undefined4 *)((long)pvVar14 + (long)iVar31 * 4 + -4);
            *(int *)((long)pvVar14 + (long)iVar31 * 4 + -4) = iVar28;
            iVar11 = iVar11 + -1;
          }
          else {
            dVar44 = dVar44 - dVar42;
            if (1e-12 < dVar44) {
              if (dVar44 <= dVar40) {
                dVar44 = dVar40;
              }
              dVar40 = dVar44;
              pdVar4 = this->B;
              pdVar7 = this->G;
              uVar12 = 0;
              do {
                pdVar4[uVar12] =
                     *(double *)
                      ((long)__s +
                      (long)*(int *)((long)pvVar18 + uVar12 * 4 + lVar21 * 4) * 8 + lVar21 * 8) *
                     -dVar41 + pdVar7[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar29 != uVar12);
              solve_sub_problem(this,dVar41,*(int *)((long)pvVar19 + lVar27 * 4),
                                this->C[(int)ppVar6->y[lVar27]],iVar31,alpha_new);
              lVar24 = (long)*(int *)((long)pvVar20 + lVar27 * 4);
              if (lVar24 < 1) {
                uVar23 = 0;
              }
              else {
                lVar26 = 0;
                uVar23 = 0;
                do {
                  iVar28 = *(int *)((long)pvVar18 + lVar26 * 4 + lVar21 * 4);
                  dVar41 = alpha_new[lVar26] -
                           *(double *)((long)__s + (long)iVar28 * 8 + lVar21 * 8);
                  *(double *)((long)__s + (long)iVar28 * 8 + lVar21 * 8) = alpha_new[lVar26];
                  if (1e-12 <= ABS(dVar41)) {
                    *(int *)((long)pvVar16 + (long)(int)uVar23 * 4) = iVar28;
                    *(double *)((long)pvVar17 + (long)(int)uVar23 * 8) = dVar41;
                    uVar23 = uVar23 + 1;
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar24 != lVar26);
              }
              pfVar22 = this->prob->x[lVar27];
              iVar28 = pfVar22->index;
              if (iVar28 != -1) {
                iVar31 = this->nr_class;
                do {
                  if (0 < (int)uVar23) {
                    lVar27 = ((long)iVar28 + -1) * (long)iVar31;
                    uVar29 = 0;
                    do {
                      lVar21 = (long)*(int *)((long)pvVar16 + uVar29 * 4);
                      w[lVar27 + lVar21] =
                           *(double *)((long)pvVar17 + uVar29 * 8) * pfVar22->value +
                           w[lVar27 + lVar21];
                      uVar29 = uVar29 + 1;
                    } while (uVar23 != uVar29);
                  }
                  iVar28 = pfVar22[1].index;
                  pfVar22 = pfVar22 + 1;
                } while (iVar28 != -1);
              }
            }
          }
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < (int)uVar36);
    }
    local_f8 = local_f8 + 1;
    if (((uint)(local_f8 * -0x33333333) >> 1 | (uint)((local_f8 * -0x33333333 & 1U) != 0) << 0x1f) <
        0x1999999a) {
      info(".");
    }
    if (local_e0 <= dVar40) {
      bVar8 = true;
      bVar9 = false;
    }
    else if ((this->eps <= dVar40) || (!bVar9)) {
      uVar36 = (ulong)this->l;
      if (0 < (long)uVar36) {
        iVar11 = this->nr_class;
        uVar29 = 0;
        do {
          *(int *)((long)pvVar20 + uVar29 * 4) = iVar11;
          uVar29 = uVar29 + 1;
        } while (uVar36 != uVar29);
      }
      info("*");
      local_e0 = local_e0 * 0.5;
      if (local_e0 <= this->eps) {
        local_e0 = this->eps;
      }
      bVar9 = true;
      bVar8 = true;
    }
    else {
      bVar8 = false;
    }
  } while (bVar8);
  info("\noptimization finished, #iter = %d\n");
  if (this->max_iter <= local_f8) {
    info("\nWARNING: reaching max number of iterations\n");
  }
  iVar11 = this->nr_class;
  uVar23 = this->w_size * iVar11;
  if ((int)uVar23 < 1) {
    dVar40 = 0.0;
  }
  else {
    dVar40 = 0.0;
    uVar29 = 0;
    do {
      dVar40 = dVar40 + w[uVar29] * w[uVar29];
      uVar29 = uVar29 + 1;
    } while (uVar23 != uVar29);
    dVar40 = dVar40 * 0.5;
  }
  uVar23 = this->l;
  if ((int)(uVar23 * iVar11) < 1) {
    uVar10 = 0;
  }
  else {
    uVar29 = 0;
    uVar10 = 0;
    do {
      dVar41 = *(double *)((long)__s + uVar29 * 8);
      dVar40 = dVar40 + dVar41;
      uVar10 = uVar10 + (dVar41 != 0.0);
      uVar29 = uVar29 + 1;
    } while (uVar23 * iVar11 != uVar29);
  }
  if (0 < (int)uVar23) {
    uVar29 = 0;
    pvVar32 = __s;
    do {
      dVar40 = dVar40 - *(double *)((long)pvVar32 + (long)(int)this->prob->y[uVar29] * 8);
      uVar29 = uVar29 + 1;
      pvVar32 = (void *)((long)pvVar32 + (long)iVar11 * 8);
    } while (uVar23 != uVar29);
  }
  info("Objective value = %lf\n",dVar40);
  info("nSV = %d\n",(ulong)uVar10);
  operator_delete__(__s);
  operator_delete__(alpha_new);
  operator_delete__(pvVar14);
  operator_delete__(pvVar15);
  operator_delete__(pvVar16);
  operator_delete__(pvVar17);
  operator_delete__(pvVar18);
  operator_delete__(pvVar19);
  operator_delete__(pvVar20);
  return;
}

Assistant:

void Solver_MCSVM_CS::Solve(double *w)
{
	int i, m, s;
	int iter = 0;
	double *alpha =  new double[l*nr_class];
	double *alpha_new = new double[nr_class];
	int *index = new int[l];
	double *QD = new double[l];
	int *d_ind = new int[nr_class];
	double *d_val = new double[nr_class];
	int *alpha_index = new int[nr_class*l];
	int *y_index = new int[l];
	int active_size = l;
	int *active_size_i = new int[l];
	double eps_shrink = max(10.0*eps, 1.0); // stopping tolerance for shrinking
	bool start_from_all = true;

	// Initial alpha can be set here. Note that 
	// sum_m alpha[i*nr_class+m] = 0, for all i=1,...,l-1
	// alpha[i*nr_class+m] <= C[GETI(i)] if prob->y[i] == m
	// alpha[i*nr_class+m] <= 0 if prob->y[i] != m
	// If initial alpha isn't zero, uncomment the for loop below to initialize w
	for(i=0;i<l*nr_class;i++)
		alpha[i] = 0;

	for(i=0;i<w_size*nr_class;i++)
		w[i] = 0;
	for(i=0;i<l;i++)
	{
		for(m=0;m<nr_class;m++)
			alpha_index[i*nr_class+m] = m;
		feature_node *xi = prob->x[i];
		QD[i] = 0;
		while(xi->index != -1)
		{
			double val = xi->value;
			QD[i] += val*val;

			// Uncomment the for loop if initial alpha isn't zero
			// for(m=0; m<nr_class; m++)
			//	w[(xi->index-1)*nr_class+m] += alpha[i*nr_class+m]*val;
			xi++;
		}
		active_size_i[i] = nr_class;
		y_index[i] = (int)prob->y[i];
		index[i] = i;
	}

	while(iter < max_iter)
	{
		double stopping = -INF;
		for(i=0;i<active_size;i++)
		{
			int j = i+rand()%(active_size-i);
			swap(index[i], index[j]);
		}
		for(s=0;s<active_size;s++)
		{
			i = index[s];
			double Ai = QD[i];
			double *alpha_i = &alpha[i*nr_class];
			int *alpha_index_i = &alpha_index[i*nr_class];

			if(Ai > 0)
			{
				for(m=0;m<active_size_i[i];m++)
					G[m] = 1;
				if(y_index[i] < active_size_i[i])
					G[y_index[i]] = 0;

				feature_node *xi = prob->x[i];
				while(xi->index!= -1)
				{
					double *w_i = &w[(xi->index-1)*nr_class];
					for(m=0;m<active_size_i[i];m++)
						G[m] += w_i[alpha_index_i[m]]*(xi->value);
					xi++;
				}

				double minG = INF;
				double maxG = -INF;
				for(m=0;m<active_size_i[i];m++)
				{
					if(alpha_i[alpha_index_i[m]] < 0 && G[m] < minG)
						minG = G[m];
					if(G[m] > maxG)
						maxG = G[m];
				}
				if(y_index[i] < active_size_i[i])
					if(alpha_i[(int) prob->y[i]] < C[GETI(i)] && G[y_index[i]] < minG)
						minG = G[y_index[i]];

				for(m=0;m<active_size_i[i];m++)
				{
					if(be_shrunk(i, m, y_index[i], alpha_i[alpha_index_i[m]], minG))
					{
						active_size_i[i]--;
						while(active_size_i[i]>m)
						{
							if(!be_shrunk(i, active_size_i[i], y_index[i],
											alpha_i[alpha_index_i[active_size_i[i]]], minG))
							{
								swap(alpha_index_i[m], alpha_index_i[active_size_i[i]]);
								swap(G[m], G[active_size_i[i]]);
								if(y_index[i] == active_size_i[i])
									y_index[i] = m;
								else if(y_index[i] == m)
									y_index[i] = active_size_i[i];
								break;
							}
							active_size_i[i]--;
						}
					}
				}

				if(active_size_i[i] <= 1)
				{
					active_size--;
					swap(index[s], index[active_size]);
					s--;
					continue;
				}

				if(maxG-minG <= 1e-12)
					continue;
				else
					stopping = max(maxG - minG, stopping);

				for(m=0;m<active_size_i[i];m++)
					B[m] = G[m] - Ai*alpha_i[alpha_index_i[m]] ;

				solve_sub_problem(Ai, y_index[i], C[GETI(i)], active_size_i[i], alpha_new);
				int nz_d = 0;
				for(m=0;m<active_size_i[i];m++)
				{
					double d = alpha_new[m] - alpha_i[alpha_index_i[m]];
					alpha_i[alpha_index_i[m]] = alpha_new[m];
					if(fabs(d) >= 1e-12)
					{
						d_ind[nz_d] = alpha_index_i[m];
						d_val[nz_d] = d;
						nz_d++;
					}
				}

				xi = prob->x[i];
				while(xi->index != -1)
				{
					double *w_i = &w[(xi->index-1)*nr_class];
					for(m=0;m<nz_d;m++)
						w_i[d_ind[m]] += d_val[m]*xi->value;
					xi++;
				}
			}
		}

		iter++;
		if(iter % 10 == 0)
		{
			info(".");
		}

		if(stopping < eps_shrink)
		{
			if(stopping < eps && start_from_all == true)
				break;
			else
			{
				active_size = l;
				for(i=0;i<l;i++)
					active_size_i[i] = nr_class;
				info("*");
				eps_shrink = max(eps_shrink/2, eps);
				start_from_all = true;
			}
		}
		else
			start_from_all = false;
	}

	info("\noptimization finished, #iter = %d\n",iter);
	if (iter >= max_iter)
		info("\nWARNING: reaching max number of iterations\n");

	// calculate objective value
	double v = 0;
	int nSV = 0;
	for(i=0;i<w_size*nr_class;i++)
		v += w[i]*w[i];
	v = 0.5*v;
	for(i=0;i<l*nr_class;i++)
	{
		v += alpha[i];
		if(fabs(alpha[i]) > 0)
			nSV++;
	}
	for(i=0;i<l;i++)
		v -= alpha[i*nr_class+(int)prob->y[i]];
	info("Objective value = %lf\n",v);
	info("nSV = %d\n",nSV);

	delete [] alpha;
	delete [] alpha_new;
	delete [] index;
	delete [] QD;
	delete [] d_ind;
	delete [] d_val;
	delete [] alpha_index;
	delete [] y_index;
	delete [] active_size_i;
}